

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::TagOutOfOrder::TagOutOfOrder(TagOutOfOrder *this,int field,string *what)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Tag specified out of required order",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,what);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001fc8d0;
  this->field = field;
  return;
}

Assistant:

TagOutOfOrder(int field = 0, const std::string &what = "")
      : Exception("Tag specified out of required order", what),
        field(field) {}